

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  archive_string *as;
  void *_p;
  int *piVar1;
  char *__ptr;
  archive_entry *in_RDX;
  long in_RSI;
  archive *in_RDI;
  int r;
  size_t size;
  char *encoded_name;
  char *url_encoded_name;
  char *encoded_value;
  void *value;
  char *name;
  int i;
  archive_string s;
  archive_string_conv *in_stack_ffffffffffffff68;
  archive_string *in_stack_ffffffffffffff70;
  archive_string *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  wchar_t in_stack_ffffffffffffff8c;
  archive_string *in_stack_ffffffffffffff90;
  char *key;
  archive_string *paVar2;
  void *local_50;
  char *local_48;
  wchar_t local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  archive_entry *local_20;
  long local_18;
  archive *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_3c = archive_entry_xattr_reset((archive_entry *)0x18ab96);
  do {
    if (local_3c == L'\0') {
      return 0;
    }
    key = (char *)0x0;
    local_3c = local_3c + L'\xffffffff';
    archive_entry_xattr_next(local_20,&local_48,&local_50,(size_t *)&stack0xffffffffffffff90);
    as = (archive_string *)
         url_encode((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (as != (archive_string *)0x0) {
      _p = (void *)(local_18 + 0x10);
      if (as == (archive_string *)0x0) {
        in_stack_ffffffffffffff70 = (archive_string *)0x0;
        in_stack_ffffffffffffff80 = as;
      }
      else {
        paVar2 = as;
        in_stack_ffffffffffffff70 = (archive_string *)strlen((char *)as);
        in_stack_ffffffffffffff80 = as;
        as = paVar2;
      }
      in_stack_ffffffffffffff8c =
           archive_strncpy_l(in_stack_ffffffffffffff80,_p,(size_t)in_stack_ffffffffffffff70,
                             in_stack_ffffffffffffff68);
      free(as);
      if (in_stack_ffffffffffffff8c == L'\0') {
        key = *(char **)(local_18 + 0x10);
      }
      else {
        piVar1 = __errno_location();
        if (*piVar1 == 0xc) {
          archive_set_error(local_10,0xc,"Can\'t allocate memory for Linkname");
          return -0x1e;
        }
      }
    }
    __ptr = base64_encode((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (size_t)in_stack_ffffffffffffff80);
    if ((key != (char *)0x0) && (__ptr != (char *)0x0)) {
      local_38 = 0;
      local_28 = 0;
      local_30 = 0;
      archive_strncat(in_stack_ffffffffffffff90,
                      (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (size_t)in_stack_ffffffffffffff80);
      archive_strcat(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      add_pax_attr(as,key,(char *)in_stack_ffffffffffffff90);
      archive_string_free((archive_string *)0x18ad46);
    }
    free(__ptr);
  } while( true );
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	struct archive_string s;
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *encoded_value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name != NULL) {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
		}

		encoded_value = base64_encode((const char *)value, size);

		if (encoded_name != NULL && encoded_value != NULL) {
			archive_string_init(&s);
			archive_strcpy(&s, "LIBARCHIVE.xattr.");
			archive_strcat(&s, encoded_name);
			add_pax_attr(&(pax->pax_header), s.s, encoded_value);
			archive_string_free(&s);
		}
		free(encoded_value);
	}
	return (ARCHIVE_OK);
}